

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_source_generator_base.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::SourceGeneratorBase::class_access_level_abi_cxx11_
          (string *__return_storage_ptr__,SourceGeneratorBase *this)

{
  char *pcVar1;
  allocator local_11;
  
  pcVar1 = "public";
  if (this->options_->internal_access != false) {
    pcVar1 = "internal";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_11);
  return __return_storage_ptr__;
}

Assistant:

std::string SourceGeneratorBase::class_access_level() {
  return this->options()->internal_access ? "internal" : "public";
}